

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::createCommandQueuePropertiesOverride
          (CLIntercept *this,cl_device_id device,cl_queue_properties *properties,
          cl_queue_properties **pLocalQueueProperties)

{
  uint uVar1;
  cl_queue_properties cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  cl_queue_properties *pcVar7;
  ulong uVar8;
  long lVar9;
  cl_command_queue_properties props;
  cl_queue_properties **local_38;
  
  local_38 = pLocalQueueProperties;
  if ((this->m_Config).DefaultQueuePriorityHint == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = checkDeviceForExtension(this,device,"cl_khr_priority_hints");
  }
  if ((this->m_Config).DefaultQueueThrottleHint == 0) {
    bVar5 = false;
  }
  else {
    bVar5 = checkDeviceForExtension(this,device,"cl_khr_throttle_hints");
  }
  if (properties != (cl_queue_properties *)0x0) {
    bVar3 = true;
    uVar6 = 0;
    do {
      cVar2 = properties[uVar6];
      if (cVar2 == 0x1093) {
        bVar3 = false;
      }
      else if (cVar2 == 0x1096) {
        bVar4 = false;
      }
      else if (cVar2 == 0x1097) {
        bVar5 = false;
      }
      else if (cVar2 == 0) goto LAB_0016803f;
      uVar6 = uVar6 + 2;
    } while( true );
  }
  bVar3 = true;
  uVar8 = 2;
LAB_0016805b:
  uVar6 = uVar8 + 4;
  if (bVar5 == false) {
    uVar6 = uVar8;
  }
  lVar9 = 0;
  pcVar7 = (cl_queue_properties *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 << 3 | 8);
  *local_38 = pcVar7;
  if (properties != (cl_queue_properties *)0x0) {
    for (lVar9 = 0; cVar2 = properties[lVar9], cVar2 != 0; lVar9 = lVar9 + 2) {
      pcVar7[lVar9] = cVar2;
      if (cVar2 == 0x1093) {
        props = properties[lVar9 + 1];
        modifyCommandQueueProperties(this,&props);
      }
      else {
        props = properties[lVar9 + 1];
      }
      pcVar7[lVar9 + 1] = props;
    }
  }
  if (bVar4 != false) {
    uVar1 = (this->m_Config).DefaultQueuePriorityHint;
    pcVar7[lVar9] = 0x1096;
    pcVar7[lVar9 + 1] = (ulong)uVar1;
    lVar9 = lVar9 + 2;
  }
  if (bVar5 != false) {
    uVar1 = (this->m_Config).DefaultQueueThrottleHint;
    pcVar7[lVar9] = 0x1097;
    pcVar7[lVar9 + 1] = (ulong)uVar1;
    lVar9 = lVar9 + 2;
  }
  if (bVar3) {
    props = 0;
    modifyCommandQueueProperties(this,&props);
    pcVar7[lVar9] = 0x1093;
    pcVar7[lVar9 + 1] = props;
    lVar9 = lVar9 + 2;
  }
  pcVar7[lVar9] = 0;
  return;
LAB_0016803f:
  uVar8 = uVar6 + 2;
  if (!bVar3) {
    uVar8 = uVar6;
  }
  goto LAB_0016805b;
}

Assistant:

void CLIntercept::createCommandQueuePropertiesOverride(
    cl_device_id device,
    const cl_queue_properties* properties,
    cl_queue_properties*& pLocalQueueProperties ) const
{
    // We're always going to add command queue properties, unless command queue
    // properties already exist (requesting the same property twice is an
    // error).  We also may add priority hints or throttle hints, in some cases.
    // So, look through the queue properties for these enums.  We need to do
    // this anyways to count the number of property pairs.
    bool    addCommandQueuePropertiesEnum = true;
    bool    addPriorityHintEnum =
                config().DefaultQueuePriorityHint != 0 &&
                checkDeviceForExtension( device, "cl_khr_priority_hints" );
    bool    addThrottleHintEnum =
                config().DefaultQueueThrottleHint != 0 &&
                checkDeviceForExtension( device, "cl_khr_throttle_hints" );

    size_t  numProperties = 0;
    if( properties )
    {
        while( properties[ numProperties ] != 0 )
        {
            switch( properties[ numProperties ] )
            {
            case CL_QUEUE_PROPERTIES:
                addCommandQueuePropertiesEnum = false;
                break;
            case CL_QUEUE_PRIORITY_KHR:
                addPriorityHintEnum = false;
                break;
            case CL_QUEUE_THROTTLE_KHR:
                addThrottleHintEnum = false;
                break;
            default:
                break;
            }
            numProperties += 2;
        }
    }

    if( addCommandQueuePropertiesEnum )
    {
        numProperties += 2;
    }
    if( addThrottleHintEnum )
    {
        numProperties += 2;
    }
    if( addThrottleHintEnum )
    {
        numProperties += 2;
    }

    // Allocate a new array of properties.  We need to allocate two
    // properties for each pair, plus one property for the terminating
    // zero.
    pLocalQueueProperties = new cl_queue_properties[ numProperties + 1 ];
    if( pLocalQueueProperties )
    {
        // Copy the old properties array to the new properties array,
        // if the new properties array exists.
        numProperties = 0;
        if( properties )
        {
            while( properties[ numProperties ] != 0 )
            {
                pLocalQueueProperties[ numProperties ] = properties[ numProperties ];
                if( properties[ numProperties ] == CL_QUEUE_PROPERTIES )
                {
                    CLI_ASSERT( addCommandQueuePropertiesEnum == false );

                    cl_command_queue_properties props = properties[ numProperties + 1 ];

                    modifyCommandQueueProperties( props );

                    pLocalQueueProperties[ numProperties + 1 ] = props;
                }
                else
                {
                    pLocalQueueProperties[ numProperties + 1 ] =
                        properties[ numProperties + 1 ];
                }
                numProperties += 2;
            }
        }
        if( addPriorityHintEnum )
        {
            CLI_ASSERT( config().DefaultQueuePriorityHint != 0 );
            pLocalQueueProperties[ numProperties] = CL_QUEUE_PRIORITY_KHR;
            pLocalQueueProperties[ numProperties + 1 ] = config().DefaultQueuePriorityHint;
            numProperties += 2;
        }
        if( addThrottleHintEnum )
        {
            CLI_ASSERT( config().DefaultQueueThrottleHint != 0 );
            pLocalQueueProperties[ numProperties] = CL_QUEUE_THROTTLE_KHR;
            pLocalQueueProperties[ numProperties + 1 ] = config().DefaultQueueThrottleHint;
            numProperties += 2;
        }

        // This setting is added last in the list, in order to better behave with runtimes
        // truncating it when a property has a value of 0, which may be the case below.
        if( addCommandQueuePropertiesEnum )
        {
            cl_command_queue_properties props = 0;

            modifyCommandQueueProperties(props);

            pLocalQueueProperties[numProperties] = CL_QUEUE_PROPERTIES;
            pLocalQueueProperties[numProperties + 1] = props;
            numProperties += 2;
        }

        // Add the terminating zero.
        pLocalQueueProperties[ numProperties ] = 0;
    }
}